

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O1

void __thiscall
burst::
difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
::difference_iterator
          (difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
           *this,_List_node_base *minuend_begin,_List_node_base *minuend_end,int *subtrahend_begin,
          int *subtrahend_end)

{
  _List_node_base *p_Var1;
  int *piVar2;
  _List_node_base *p_Var3;
  int *piVar4;
  
  (this->m_minuend_begin)._M_node = minuend_begin;
  (this->m_minuend_end)._M_node = minuend_end;
  (this->m_subtrahend_begin)._M_current = subtrahend_begin;
  (this->m_subtrahend_end)._M_current = subtrahend_end;
  p_Var3 = minuend_end;
  if (minuend_begin != minuend_end) {
    do {
      p_Var3 = minuend_begin->_M_next;
      if (p_Var3 == minuend_end) break;
      p_Var1 = minuend_begin + 1;
      minuend_begin = p_Var3;
    } while (*(int *)&p_Var1->_M_next <= *(int *)&p_Var3[1]._M_next);
  }
  if (p_Var3 != minuend_end) {
    __assert_fail("std::is_sorted(m_minuend_begin, m_minuend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6b,
                  "burst::difference_iterator<std::_List_const_iterator<int>, __gnu_cxx::__normal_iterator<const int *, std::vector<int>>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<int>, ForwardIterator2 = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, Compare = std::less<void>]"
                 );
  }
  piVar4 = subtrahend_end;
  if (subtrahend_begin != subtrahend_end) {
    piVar2 = subtrahend_begin + 1;
    do {
      piVar4 = piVar2;
      if (piVar4 == subtrahend_end) break;
      piVar2 = piVar4 + 1;
    } while (piVar4[-1] <= *piVar4);
  }
  if (piVar4 == subtrahend_end) {
    maintain_invariant(this);
    return;
  }
  __assert_fail("std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare)",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                ,0x6c,
                "burst::difference_iterator<std::_List_const_iterator<int>, __gnu_cxx::__normal_iterator<const int *, std::vector<int>>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<int>, ForwardIterator2 = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, Compare = std::less<void>]"
               );
}

Assistant:

difference_iterator
            (
                minuend_iterator minuend_begin,
                minuend_iterator minuend_end,
                subtrahend_iterator subtrahend_begin,
                subtrahend_iterator subtrahend_end,
                Compare compare = Compare()
            ):
            m_minuend_begin(std::move(minuend_begin)),
            m_minuend_end(std::move(minuend_end)),
            m_subtrahend_begin(std::move(subtrahend_begin)),
            m_subtrahend_end(std::move(subtrahend_end)),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_minuend_begin, m_minuend_end, compare));
            BOOST_ASSERT(std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare));

            maintain_invariant();
        }